

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.cpp
# Opt level: O1

RGBFilm * pbrt::RGBFilm::Create
                    (ParameterDictionary *parameters,Float exposureTime,FilterHandle *filter,
                    RGBColorSpace *colorSpace,FileLoc *loc,Allocator alloc)

{
  Point2<int> *pPVar1;
  int iVar2;
  PixelSensor *sensor;
  undefined4 extraout_var;
  bool writeFP16;
  Float maxComponentValue;
  FilmBaseParameters filmBaseParameters;
  bool local_a1;
  polymorphic_allocator<std::byte> local_a0;
  Float local_94;
  Float local_90;
  Float local_8c;
  RGBColorSpace *local_88;
  FilmBaseParameters local_80;
  TaggedPointer<pbrt::BoxFilter,_pbrt::GaussianFilter,_pbrt::MitchellFilter,_pbrt::LanczosSincFilter,_pbrt::TriangleFilter>
  local_30;
  
  pPVar1 = &local_80.pixelBounds.pMax;
  local_a0.memoryResource = alloc.memoryResource;
  local_90 = exposureTime;
  local_88 = colorSpace;
  local_80.fullResolution.super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)pPVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"maxcomponentvalue","");
  local_8c = ParameterDictionary::GetOneFloat(parameters,(string *)&local_80,INFINITY);
  if (local_80.fullResolution.super_Tuple2<pbrt::Point2,_int> != (Tuple2<pbrt::Point2,_int>)pPVar1)
  {
    local_94 = local_8c;
    operator_delete((void *)local_80.fullResolution.super_Tuple2<pbrt::Point2,_int>,
                    (long)local_80.pixelBounds.pMax.super_Tuple2<pbrt::Point2,_int> + 1);
    local_8c = local_94;
  }
  local_80.fullResolution.super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)pPVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"savefp16","");
  local_a1 = ParameterDictionary::GetOneBool(parameters,(string *)&local_80,true);
  if (local_80.fullResolution.super_Tuple2<pbrt::Point2,_int> != (Tuple2<pbrt::Point2,_int>)pPVar1)
  {
    operator_delete((void *)local_80.fullResolution.super_Tuple2<pbrt::Point2,_int>,
                    (long)local_80.pixelBounds.pMax.super_Tuple2<pbrt::Point2,_int> + 1);
  }
  sensor = PixelSensor::Create(parameters,local_88,local_90,loc,(Allocator)local_a0.memoryResource);
  local_30.bits =
       (filter->
       super_TaggedPointer<pbrt::BoxFilter,_pbrt::GaussianFilter,_pbrt::MitchellFilter,_pbrt::LanczosSincFilter,_pbrt::TriangleFilter>
       ).bits;
  FilmBaseParameters::FilmBaseParameters(&local_80,parameters,(FilterHandle *)&local_30,sensor,loc);
  iVar2 = (*(local_a0.memoryResource)->_vptr_memory_resource[2])(local_a0.memoryResource,0xa8,8);
  pstd::pmr::polymorphic_allocator<std::byte>::
  construct<pbrt::RGBFilm,pbrt::FilmBaseParameters&,pbrt::RGBColorSpace_const*&,float&,bool&,pstd::pmr::polymorphic_allocator<std::byte>&>
            (&local_a0,(RGBFilm *)CONCAT44(extraout_var,iVar2),&local_80,&local_88,&local_8c,
             &local_a1,&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.filename._M_dataplus._M_p != &local_80.filename.field_2) {
    operator_delete(local_80.filename._M_dataplus._M_p,
                    local_80.filename.field_2._M_allocated_capacity + 1);
  }
  return (RGBFilm *)CONCAT44(extraout_var,iVar2);
}

Assistant:

RGBFilm *RGBFilm::Create(const ParameterDictionary &parameters, Float exposureTime,
                         FilterHandle filter, const RGBColorSpace *colorSpace,
                         const FileLoc *loc, Allocator alloc) {
    Float maxComponentValue = parameters.GetOneFloat("maxcomponentvalue", Infinity);
    bool writeFP16 = parameters.GetOneBool("savefp16", true);

    PixelSensor *sensor =
        PixelSensor::Create(parameters, colorSpace, exposureTime, loc, alloc);
    FilmBaseParameters filmBaseParameters(parameters, filter, sensor, loc);

    return alloc.new_object<RGBFilm>(filmBaseParameters, colorSpace, maxComponentValue,
                                     writeFP16, alloc);
}